

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O2

void __thiscall getarg_tests::doubledash::test_method(doubledash *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  string *psVar5;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  allocator<char> local_3b9;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  allocator<char> local_381;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  pair<const_char_*,_ArgsManager::Flags> local_350;
  pair<const_char_*,_ArgsManager::Flags> local_340;
  string local_330;
  string local_310;
  string local_2f0;
  undefined1 local_2d0 [40];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2a8;
  ArgsManager local_args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_args);
  local_340.first = "-foo";
  local_350.second = ALLOW_ANY;
  local_350.first = "-bar";
  local_340.second = local_350.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)local_2d0,&local_340);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_2a8,&local_350);
  __l._M_len = 2;
  __l._M_array = (iterator)local_2d0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)&local_2f0,__l,(allocator_type *)&local_310);
  SetupArgs(&local_args,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&local_2f0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&local_2f0);
  lVar3 = 0x28;
  do {
    std::__cxx11::string::~string((string *)(local_2d0 + lVar3));
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"--foo",(allocator<char> *)&local_2f0);
  ResetArgs(&local_args,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x188;
  file.m_begin = (iterator)&local_360;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_370,msg);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_378 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"-foo",(allocator<char> *)&local_330);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2f0,false);
  psVar5 = &local_310;
  local_310._M_dataplus._M_p._0_1_ = bVar2;
  local_381 = (allocator<char>)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d0,&local_380,0x188,1,2,psVar5,"local_args.GetBoolArg(\"-foo\", false)",
             &local_381,"true");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"--foo=verbose --bar=1",(allocator<char> *)&local_2f0);
  ResetArgs(&local_args,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)psVar5;
  msg_00.m_begin = pvVar4;
  file_00.m_end = (iterator)0x18b;
  file_00.m_begin = (iterator)&local_398;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3a8,
             msg_00);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3b0 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"-foo",&local_381);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_3b9);
  ArgsManager::GetArg(&local_2f0,&local_args,&local_310,&local_330);
  pvVar4 = (iterator)0x2;
  psVar5 = &local_2f0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
            (local_2d0,&local_3b8,0x18b,1,2,psVar5,"local_args.GetArg(\"-foo\", \"\")","verbose",
             "\"verbose\"");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)psVar5;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x18c;
  file_01.m_begin = (iterator)&local_3d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3e0,
             msg_01);
  local_2d0[8] = 0;
  local_2d0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_2d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2d0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3e8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"-bar",&local_381);
  local_310._M_dataplus._M_p = (pointer)ArgsManager::GetIntArg(&local_args,&local_2f0,0);
  local_330._M_dataplus._M_p._0_4_ = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d0,&local_3f0,0x18c,1,2,&local_310,"local_args.GetIntArg(\"-bar\", 0)",
             &local_330,"1");
  std::__cxx11::string::~string((string *)&local_2f0);
  ArgsManager::~ArgsManager(&local_args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(doubledash)
{
    ArgsManager local_args;

    const auto foo = std::make_pair("-foo", ArgsManager::ALLOW_ANY);
    const auto bar = std::make_pair("-bar", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {foo, bar});
    ResetArgs(local_args, "--foo");
    BOOST_CHECK_EQUAL(local_args.GetBoolArg("-foo", false), true);

    ResetArgs(local_args, "--foo=verbose --bar=1");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "verbose");
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-bar", 0), 1);
}